

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_interface.cc
# Opt level: O2

void __thiscall sentencepiece::ModelInterface::InitializePieces(ModelInterface *this)

{
  PieceToIdMap *this_00;
  ModelProto *pMVar1;
  _Tuple_impl<0UL,_sentencepiece::normalizer::PrefixMatcher_*,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
  _Var2;
  undefined8 __p;
  _Rehash_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
  *p_Var3;
  bool bVar4;
  uint uVar5;
  Type *pTVar6;
  undefined8 *puVar7;
  undefined1 *puVar8;
  size_t *psVar9;
  char *extraout_RDX;
  char *pcVar10;
  int i;
  int iVar11;
  _Rehash_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
  *collection;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  int iVar12;
  int iVar13;
  string_view piece;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  pair<std::_Rb_tree_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool> pVar14;
  reference rVar15;
  _Bit_iterator _Var16;
  undefined1 local_e0 [32];
  Status local_c0;
  int local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _Rehash_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
  *local_90;
  vector<bool,_std::allocator<bool>_> byte_found;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  user_defined_symbols;
  
  this_00 = &this->pieces_;
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&this_00->_M_h);
  local_90 = (_Rehash_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
              *)&this->reserved_id_map_;
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)local_90);
  this->unk_id_ = -1;
  user_defined_symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &user_defined_symbols._M_t._M_impl.super__Rb_tree_header._M_header;
  user_defined_symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  user_defined_symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  user_defined_symbols._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0._0_8_ = local_e0._0_8_ & 0xffffffffffffff00;
  user_defined_symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       user_defined_symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&byte_found,0x100,(bool *)local_e0,(allocator_type *)&local_b0);
  iVar12 = 0;
  iVar13 = 0;
  for (iVar11 = 0; iVar11 < (this->model_proto_->pieces_).super_RepeatedPtrFieldBase.current_size_;
      iVar11 = iVar11 + 1) {
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::TypeHandler>
                       (&(this->model_proto_->pieces_).super_RepeatedPtrFieldBase,iVar11);
    if (((uint)pTVar6->type_ < 6) && ((0x32U >> (pTVar6->type_ & 0x1fU) & 1) != 0)) {
      iVar13 = iVar13 + 1;
    }
    else {
      iVar12 = iVar12 + 1;
    }
  }
  std::__detail::
  _Rehash_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
             *)this_00,(long)iVar13);
  p_Var3 = local_90;
  std::__detail::
  _Rehash_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve(local_90,(long)iVar12);
  local_b4 = 0;
  while( true ) {
    pMVar1 = this->model_proto_;
    if ((pMVar1->pieces_).super_RepeatedPtrFieldBase.current_size_ <= local_b4) break;
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::TypeHandler>
                       (&(pMVar1->pieces_).super_RepeatedPtrFieldBase,local_b4);
    puVar7 = (undefined8 *)((ulong)(pTVar6->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    _Var2.super__Head_base<0UL,_sentencepiece::normalizer::PrefixMatcher_*,_false>._M_head_impl =
         ((_Tuple_impl<0UL,_sentencepiece::normalizer::PrefixMatcher_*,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
           *)(puVar7 + 1))->super__Head_base<0UL,_sentencepiece::normalizer::PrefixMatcher_*,_false>
    ;
    if (_Var2.super__Head_base<0UL,_sentencepiece::normalizer::PrefixMatcher_*,_false>._M_head_impl
        == (PrefixMatcher *)0x0) {
      str._M_str = (char *)0x18;
      str._M_len = (size_t)local_e0;
      util::InternalError(str);
      util::Status::operator=(&this->status_,(Status *)local_e0);
      goto LAB_001c4dfc;
    }
    iVar11 = pTVar6->type_;
    if (((iVar11 == 4) || (iVar11 == 1)) || (collection = p_Var3, iVar11 == 5)) {
      collection = (_Rehash_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
                    *)this_00;
    }
    local_e0._8_8_ = *puVar7;
    local_e0._0_8_ = _Var2;
    bVar4 = port::
            InsertIfNotPresent<std::unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>>
                      ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                        *)collection,(first_type *)local_e0,&local_b4);
    if (!bVar4) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(pTVar6->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                     " is already defined.");
      str_00._M_str = (char *)local_e0._8_8_;
      str_00._M_len = (size_t)&local_b0;
      util::InternalError(str_00);
      util::Status::operator=(&this->status_,(Status *)&local_b0);
      util::Status::~Status((Status *)&local_b0);
      this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
LAB_001c4dcd:
      std::__cxx11::string::~string((string *)this_01);
      goto LAB_001c4e06;
    }
    iVar11 = pTVar6->type_;
    pcVar10 = extraout_RDX;
    if (iVar11 == 4) {
      puVar7 = (undefined8 *)((ulong)(pTVar6->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      local_e0._8_8_ = *puVar7;
      local_e0._0_8_ =
           ((__uniq_ptr_impl<sentencepiece::normalizer::PrefixMatcher,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
             *)(puVar7 + 1))->_M_t;
      pVar14 = std::
               _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
               ::_M_insert_unique<std::basic_string_view<char,std::char_traits<char>>>
                         ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                           *)&user_defined_symbols,(first_type *)local_e0);
      pcVar10 = pVar14._8_8_;
      iVar11 = pTVar6->type_;
    }
    if (iVar11 == 6) {
      puVar8 = (undefined1 *)this->model_proto_->trainer_spec_;
      if ((TrainerSpec *)puVar8 == (TrainerSpec *)0x0) {
        puVar8 = _TrainerSpec_default_instance_;
      }
      if (((TrainerSpec *)puVar8)->byte_fallback_ == false) {
        std::operator+(&local_b0,"byte piece ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(pTVar6->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                       ,&local_b0," is found although `byte_fallback` is false.");
        str_02._M_str = (char *)local_e0._8_8_;
        str_02._M_len = (size_t)&local_c0;
        util::InternalError(str_02);
        util::Status::operator=(&this->status_,&local_c0);
      }
      else {
        psVar9 = (size_t *)((ulong)(pTVar6->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        piece._M_str = pcVar10;
        piece._M_len = *psVar9;
        uVar5 = PieceToByte((sentencepiece *)psVar9[1],piece);
        if (-1 < (int)uVar5) {
          rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[](&byte_found,(ulong)uVar5);
          *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
          goto LAB_001c4b8a;
        }
        std::operator+(&local_b0,"byte piece ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(pTVar6->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                       ,&local_b0," is invalid.");
        str_04._M_str = (char *)local_e0._8_8_;
        str_04._M_len = (size_t)&local_c0;
        util::InternalError(str_04);
        util::Status::operator=(&this->status_,&local_c0);
      }
      util::Status::~Status(&local_c0);
      std::__cxx11::string::~string((string *)local_e0);
      this_01 = &local_b0;
      goto LAB_001c4dcd;
    }
    if (iVar11 == 2) {
      if (-1 < this->unk_id_) {
        str_03._M_str = (char *)0x17;
        str_03._M_len = (size_t)local_e0;
        util::InternalError(str_03);
        util::Status::operator=(&this->status_,(Status *)local_e0);
        goto LAB_001c4dfc;
      }
      this->unk_id_ = local_b4;
    }
LAB_001c4b8a:
    local_b4 = local_b4 + 1;
  }
  if (this->unk_id_ == -1) {
    str_01._M_str = (char *)0x13;
    str_01._M_len = (size_t)local_e0;
    util::InternalError(str_01);
    util::Status::operator=(&this->status_,(Status *)local_e0);
LAB_001c4dfc:
    util::Status::~Status((Status *)local_e0);
  }
  else {
    puVar8 = (undefined1 *)pMVar1->trainer_spec_;
    if ((TrainerSpec *)puVar8 == (TrainerSpec *)0x0) {
      puVar8 = _TrainerSpec_default_instance_;
    }
    if (((TrainerSpec *)puVar8)->byte_fallback_ == true) {
      local_e0._0_8_ = local_e0._0_8_ & 0xffffffffffffff00;
      _Var16 = std::__find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                         (byte_found.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                          byte_found.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                          byte_found.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
      if ((_Var16.super__Bit_iterator_base._M_p !=
           byte_found.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p) ||
         (_Var16.super__Bit_iterator_base._M_offset !=
          byte_found.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset)) {
        str_05._M_str = (char *)0x3f;
        str_05._M_len = (size_t)local_e0;
        util::InternalError(str_05);
        util::Status::operator=(&this->status_,(Status *)local_e0);
        goto LAB_001c4dfc;
      }
    }
    std::
    make_unique<sentencepiece::normalizer::PrefixMatcher,std::set<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&>
              ((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)local_e0);
    __p = local_e0._0_8_;
    local_e0._0_8_ =
         (__uniq_ptr_impl<sentencepiece::normalizer::PrefixMatcher,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
          )0x0;
    std::
    __uniq_ptr_impl<sentencepiece::normalizer::PrefixMatcher,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
    ::reset((__uniq_ptr_impl<sentencepiece::normalizer::PrefixMatcher,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
             *)&this->matcher_,(pointer)__p);
    std::
    unique_ptr<sentencepiece::normalizer::PrefixMatcher,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
    ::~unique_ptr((unique_ptr<sentencepiece::normalizer::PrefixMatcher,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
                   *)local_e0);
  }
LAB_001c4e06:
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&byte_found.super__Bvector_base<std::allocator<bool>_>);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Rb_tree(&user_defined_symbols._M_t);
  return;
}

Assistant:

void ModelInterface::InitializePieces() {
  pieces_.clear();
  reserved_id_map_.clear();
  unk_id_ = -1;

  std::set<absl::string_view> user_defined_symbols;
  std::vector<bool> byte_found(256, false);

  int pieces_size = 0;
  int reserved_id_map_size = 0;
  for (int i = 0; i < model_proto_->pieces_size(); ++i) {
    const auto &sp = model_proto_->pieces(i);
    const bool is_normal_piece =
        (sp.type() == ModelProto::SentencePiece::NORMAL ||
         sp.type() == ModelProto::SentencePiece::USER_DEFINED ||
         sp.type() == ModelProto::SentencePiece::UNUSED);
    if (is_normal_piece) {
      ++pieces_size;
    } else {
      ++reserved_id_map_size;
    }
  }
  pieces_.reserve(pieces_size);
  reserved_id_map_.reserve(reserved_id_map_size);

  for (int i = 0; i < model_proto_->pieces_size(); ++i) {
    const auto &sp = model_proto_->pieces(i);
    if (sp.piece().empty()) {
      status_ = util::InternalError("piece must not be empty.");
      return;
    }

    const bool is_normal_piece =
        (sp.type() == ModelProto::SentencePiece::NORMAL ||
         sp.type() == ModelProto::SentencePiece::USER_DEFINED ||
         sp.type() == ModelProto::SentencePiece::UNUSED);
    if (!port::InsertIfNotPresent(
            is_normal_piece ? &pieces_ : &reserved_id_map_, sp.piece(), i)) {
      status_ = util::InternalError(sp.piece() + " is already defined.");
      return;
    }

    if (sp.type() == ModelProto::SentencePiece::USER_DEFINED) {
      user_defined_symbols.insert(sp.piece());
    }

    if (sp.type() == ModelProto::SentencePiece::UNKNOWN) {
      if (unk_id_ >= 0) {
        status_ = util::InternalError("unk is already defined.");
        return;
      }
      unk_id_ = i;
    }

    if (sp.type() == ModelProto::SentencePiece::BYTE) {
      if (!model_proto_->trainer_spec().byte_fallback()) {
        status_ =
            util::InternalError("byte piece " + sp.piece() +
                                " is found although `byte_fallback` is false.");
        return;
      }
      const int byte = PieceToByte(sp.piece());
      if (0 <= byte && byte < 256) {
        byte_found[byte] = true;
      } else {
        status_ =
            util::InternalError("byte piece " + sp.piece() + " is invalid.");
        return;
      }
    }
  }

  if (unk_id_ == -1) {
    status_ = util::InternalError("unk is not defined.");
    return;
  }

  if (model_proto_->trainer_spec().byte_fallback()) {
    // Checks that there are 256 byte pieces.
    if (std::find(byte_found.begin(), byte_found.end(), false) !=
        byte_found.end()) {
      status_ = util::InternalError(
          "there are not 256 byte pieces although `byte_fallback` is true.");
      return;
    }
  }

  matcher_ = std::make_unique<normalizer::PrefixMatcher>(user_defined_symbols);
}